

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view action,
          MessageLite *message)

{
  string_view pc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  undefined1 local_158 [80];
  string_view local_108;
  AlphaNum local_f8;
  AlphaNum local_c8;
  MessageLite *local_98;
  size_t sStack_90;
  AlphaNum local_88;
  AlphaNum local_58;
  MessageLite *local_28;
  MessageLite *message_local;
  string_view action_local;
  
  local_28 = (MessageLite *)action._M_str;
  action_local._M_len = action._M_len;
  message_local = (MessageLite *)this;
  action_local._M_str = (char *)__return_storage_ptr__;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_58,"Can\'t ");
  local_98 = message_local;
  sStack_90 = action_local._M_len;
  pc._M_str = (char *)action_local._M_len;
  pc._M_len = (size_t)message_local;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_88,pc);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c8," message of type \"");
  local_108 = protobuf::MessageLite::GetTypeName(local_28);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,local_108);
  absl::lts_20250127::AlphaNum::AlphaNum
            ((AlphaNum *)(local_158 + 0x20),"\" because it is missing required fields: ");
  protobuf::MessageLite::InitializationErrorString_abi_cxx11_((string *)local_158,local_28);
  absl::lts_20250127::StrCat<std::__cxx11::string>
            (__return_storage_ptr__,(lts_20250127 *)&local_58,&local_88,&local_c8,&local_f8,
             (AlphaNum *)(local_158 + 0x20),(AlphaNum *)local_158,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string((string *)local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializationErrorMessage(absl::string_view action,
                                       const MessageLite& message) {
  return absl::StrCat("Can't ", action, " message of type \"",
                      message.GetTypeName(),
                      "\" because it is missing required fields: ",
                      message.InitializationErrorString());
}